

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

COVER_epoch_info_t COVER_computeEpochs(U32 maxDictSize,U32 nbDmers,U32 k,U32 passes)

{
  COVER_epoch_info_t CVar1;
  uint uVar2;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  U32 minEpochSize;
  COVER_epoch_info_t epochs;
  uint local_24;
  uint local_20;
  uint local_8;
  uint uStack_4;
  
  uVar2 = in_EDX * 10;
  if ((int)(((ulong)in_EDI / (ulong)in_EDX) / (ulong)in_ECX) == 0) {
    local_20 = 1;
  }
  else {
    local_20 = (uint)(((ulong)in_EDI / (ulong)in_EDX) / (ulong)in_ECX);
  }
  local_8 = local_20;
  uStack_4 = in_ESI / local_20;
  if (uStack_4 < uVar2) {
    local_24 = in_ESI;
    if (uVar2 < in_ESI) {
      local_24 = uVar2;
    }
    uStack_4 = local_24;
    local_8 = in_ESI / local_24;
    if (in_ESI < local_24 * local_8) {
      __assert_fail("epochs.size * epochs.num <= nbDmers",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xb232,"COVER_epoch_info_t COVER_computeEpochs(U32, U32, U32, U32)");
    }
  }
  else if (in_ESI < uStack_4 * local_20) {
    __assert_fail("epochs.size * epochs.num <= nbDmers",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xb22d,"COVER_epoch_info_t COVER_computeEpochs(U32, U32, U32, U32)");
  }
  CVar1.size = uStack_4;
  CVar1.num = local_8;
  return CVar1;
}

Assistant:

COVER_epoch_info_t COVER_computeEpochs(U32 maxDictSize,
                                       U32 nbDmers, U32 k, U32 passes)
{
  const U32 minEpochSize = k * 10;
  COVER_epoch_info_t epochs;
  epochs.num = MAX(1, maxDictSize / k / passes);
  epochs.size = nbDmers / epochs.num;
  if (epochs.size >= minEpochSize) {
      assert(epochs.size * epochs.num <= nbDmers);
      return epochs;
  }
  epochs.size = MIN(minEpochSize, nbDmers);
  epochs.num = nbDmers / epochs.size;
  assert(epochs.size * epochs.num <= nbDmers);
  return epochs;
}